

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O2

void __thiscall GetOpt::GetOpt_pp::_parse_sub_file(GetOpt_pp *this,string *file)

{
  istream *piVar1;
  OptionsFileNotFoundEx *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string arg;
  ifstream ifile;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&ifile,(file->_M_dataplus)._M_p,_S_in);
  if ((abStack_208[*(long *)(_ifile + -0x18)] & 5) == 0) {
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    arg._M_dataplus._M_p = (pointer)&arg.field_2;
    arg._M_string_length = 0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arg.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::operator>>((istream *)&ifile,(string *)&arg);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args,&arg);
    }
    _parse(this,&args);
    std::__cxx11::string::~string((string *)&arg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::ifstream::~ifstream(&ifile);
    return;
  }
  this_00 = (OptionsFileNotFoundEx *)__cxa_allocate_exception(0x28);
  OptionsFileNotFoundEx::OptionsFileNotFoundEx(this_00,file);
  __cxa_throw(this_00,&OptionsFileNotFoundEx::typeinfo,OptionsFileNotFoundEx::~OptionsFileNotFoundEx
             );
}

Assistant:

GETOPT_INLINE void GetOpt_pp::_parse_sub_file(const std::string& file)
{
    std::ifstream ifile(file.c_str());
    if (!ifile)
        throw OptionsFileNotFoundEx(file);

    std::vector<std::string> args;
    std::string arg;

    while (ifile >> arg)
        args.push_back(arg);

    _parse(args);
}